

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerGLSL::skip_argument(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRType *type;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  bVar1 = VectorView<spirv_cross::CombinedImageSampler>::empty
                    (&(this->super_Compiler).combined_image_samplers.
                      super_VectorView<spirv_cross::CombinedImageSampler>);
  if (((bVar1) && (((this->options).vulkan_semantics & 1U) != 0)) ||
     ((pSVar2 = Compiler::expression_type(&this->super_Compiler,id), pSVar2->basetype != Sampler &&
      ((pSVar2->basetype != Image || ((pSVar2->image).sampled != 1)))))) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::skip_argument(uint32_t id) const
{
	if (!combined_image_samplers.empty() || !options.vulkan_semantics)
	{
		auto &type = expression_type(id);
		if (type.basetype == SPIRType::Sampler || (type.basetype == SPIRType::Image && type.image.sampled == 1))
			return true;
	}
	return false;
}